

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinscachepair_tests.cpp
# Opt level: O3

void __thiscall
coinscachepair_tests::linked_list_add_flags::test_method(linked_list_add_flags *this)

{
  CCoinsCacheEntry *pCVar1;
  uint8_t uVar2;
  CoinsCachePair *pCVar3;
  CoinsCachePair *pCVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string file_34;
  const_string file_35;
  const_string file_36;
  const_string file_37;
  const_string file_38;
  const_string file_39;
  const_string file_40;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  const_string msg_34;
  const_string msg_35;
  const_string msg_36;
  const_string msg_37;
  const_string msg_38;
  const_string msg_39;
  const_string msg_40;
  undefined1 *local_770;
  undefined1 *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  undefined1 *local_730;
  undefined1 *local_728;
  char *local_720;
  char *local_718;
  undefined1 *local_710;
  undefined1 *local_708;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  undefined1 *local_6d0;
  undefined1 *local_6c8;
  char *local_6c0;
  char *local_6b8;
  undefined1 *local_6b0;
  undefined1 *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  undefined1 *local_670;
  undefined1 *local_668;
  char *local_660;
  char *local_658;
  undefined1 *local_650;
  undefined1 *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  undefined1 *local_610;
  undefined1 *local_608;
  char *local_600;
  char *local_5f8;
  undefined1 *local_5f0;
  undefined1 *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  char *local_5a0;
  char *local_598;
  undefined1 *local_590;
  undefined1 *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  undefined1 *local_550;
  undefined1 *local_548;
  char *local_540;
  char *local_538;
  undefined1 *local_530;
  undefined1 *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  undefined1 *local_4f0;
  undefined1 *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  undefined1 *local_430;
  undefined1 *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  undefined1 *local_3d0;
  undefined1 *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  undefined1 *local_310;
  undefined1 *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  CoinsCachePair *local_270;
  undefined8 local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  lazy_ostream local_240;
  undefined1 *local_230;
  char *local_228;
  undefined1 *local_220;
  undefined1 *local_218;
  char *local_210;
  char *local_208;
  CoinsCachePair **local_200;
  undefined **local_1f8;
  undefined1 local_1f0;
  undefined1 *local_1e8;
  CoinsCachePair ***local_1e0;
  CoinsCachePair **local_1d8;
  undefined **local_1d0;
  undefined1 local_1c8;
  undefined1 *local_1c0;
  CoinsCachePair ***local_1b8;
  char *local_1b0;
  char *local_1a8;
  assertion_result local_1a0;
  CoinsCachePair local_188;
  CoinsCachePair local_118;
  CoinsCachePair local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.first.n = 0xffffffff;
  local_a8.second.m_prev = (CoinsCachePair *)0x0;
  local_a8.second.m_next = (CoinsCachePair *)0x0;
  local_a8.second.m_flags = '\0';
  local_a8.second._17_7_ = 0;
  local_a8.second.coin.out.nValue = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  local_a8.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  local_a8.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&local_a8.second);
  local_a8.second.m_prev = &local_a8;
  local_a8.second.m_flags = 1;
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_118.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_118.first.n = 0xffffffff;
  local_118.second.m_prev = (CoinsCachePair *)0x0;
  local_118.second.m_next = (CoinsCachePair *)0x0;
  local_118.second.m_flags = '\0';
  local_118.second._17_7_ = 0;
  local_118.second.coin.out.nValue = 0;
  local_118.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  local_118.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  local_118.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  local_118.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  local_118.second.coin._40_8_ = 0;
  local_a8.second.m_next = local_a8.second.m_prev;
  CCoinsCacheEntry::CCoinsCacheEntry(&local_118.second);
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_188.first.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_188.first.n = 0xffffffff;
  local_188.second.m_prev = (CoinsCachePair *)0x0;
  local_188.second.m_next = (CoinsCachePair *)0x0;
  local_188.second._16_8_ = 0;
  local_188.second.coin.out.nValue = 0;
  local_188.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
       (char *)0x0;
  local_188.second.coin.out.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  local_188.second.coin.out.scriptPubKey.super_CScriptBase._union._16_8_ = 0;
  local_188.second.coin.out.scriptPubKey.super_CScriptBase._24_8_ = 0;
  local_188.second.coin._40_8_ = 0;
  CCoinsCacheEntry::CCoinsCacheEntry(&local_188.second);
  local_210 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_208 = "";
  local_220 = &boost::unit_test::basic_cstring<char_const>::null;
  local_218 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x97;
  file.m_begin = (iterator)&local_210;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_220,msg);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_1d8 = &local_270;
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_200 = (CoinsCachePair **)&local_268;
  local_268 = (CoinsCachePair *)((ulong)local_268._4_4_ << 0x20);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\0');
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1b8 = &local_1d8;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013ae248;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0x97,&local_1d0,"0",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_248 = "";
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x98;
  file_00.m_begin = (iterator)&local_250;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_260,
             msg_00);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0x98,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_278 = "";
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  local_288 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x99;
  file_01.m_begin = (iterator)&local_280;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_290,
             msg_01);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0x99,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  uVar2 = local_118.second.m_flags;
  if (local_118.second.m_flags == '\0') {
    local_118.second.m_prev = local_a8.second.m_prev;
    local_118.second.m_next = &local_a8;
    pCVar1 = &(local_a8.second.m_prev)->second;
    local_a8.second.m_prev = &local_118;
    pCVar1->m_next = &local_118;
  }
  local_118.second._16_8_ = CONCAT71(local_118.second._17_7_,uVar2) | 1;
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x9d;
  file_02.m_begin = (iterator)&local_2a0;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b0,
             msg_02);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_268 = (CoinsCachePair *)CONCAT44(local_268._4_4_,1);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\x01');
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af730;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0x9d,&local_1d0,
             "CCoinsCacheEntry::DIRTY",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x9e;
  file_03.m_begin = (iterator)&local_2c0;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d0,
             msg_03);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a1c,(size_t)&local_1b0,0x9e,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2d8 = "";
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x9f;
  file_04.m_begin = (iterator)&local_2e0;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2f0,
             msg_04);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a2d,(size_t)&local_1b0,0x9f,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_300 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_2f8 = "";
  local_310 = &boost::unit_test::basic_cstring<char_const>::null;
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0xa0;
  file_05.m_begin = (iterator)&local_300;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_310,
             msg_05);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xa0,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0xa1;
  file_06.m_begin = (iterator)&local_320;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_330,
             msg_06);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0xa1,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_188.second.m_flags == '\0') {
    local_188.second.m_prev = local_a8.second.m_prev;
    local_188.second.m_next = &local_a8;
    ((local_a8.second.m_prev)->second).m_next = &local_188;
    local_a8.second.m_prev = &local_188;
  }
  local_188.second._16_8_ = local_188.second._16_8_ | 2;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_338 = "";
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  local_348 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0xa5;
  file_07.m_begin = (iterator)&local_340;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_350,
             msg_07);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_188.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_flags == '\x02');
  local_268 = (CoinsCachePair *)CONCAT44(local_268._4_4_,2);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af730;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a42,(size_t)&local_1b0,0xa5,&local_1d0,
             "CCoinsCacheEntry::FRESH",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_360 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_358 = "";
  local_370 = &boost::unit_test::basic_cstring<char_const>::null;
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0xa6;
  file_08.m_begin = (iterator)&local_360;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_370,
             msg_08);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a57,(size_t)&local_1b0,0xa6,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0xa7;
  file_09.m_begin = (iterator)&local_380;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_390,
             msg_09);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xa7,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_398 = "";
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0xa8;
  file_10.m_begin = (iterator)&local_3a0;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3b0,
             msg_10);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a1c,(size_t)&local_1b0,0xa8,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_3c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3b8 = "";
  local_3d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0xa9;
  file_11.m_begin = (iterator)&local_3c0;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3d0,
             msg_11);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0xa9,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0xad;
  file_12.m_begin = (iterator)&local_3e0;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3f0,
             msg_12);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\x01');
  local_268 = (CoinsCachePair *)CONCAT44(local_268._4_4_,1);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af730;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0xad,&local_1d0,
             "CCoinsCacheEntry::DIRTY",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_3f8 = "";
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0xae;
  file_13.m_begin = (iterator)&local_400;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_410,
             msg_13);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a1c,(size_t)&local_1b0,0xae,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_420 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_418 = "";
  local_430 = &boost::unit_test::basic_cstring<char_const>::null;
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0xaf;
  file_14.m_begin = (iterator)&local_420;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_430,
             msg_14);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a2d,(size_t)&local_1b0,0xaf,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_440 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_438 = "";
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0xb0;
  file_15.m_begin = (iterator)&local_440;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_450,
             msg_15);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xb0,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_460 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_458 = "";
  local_470 = &boost::unit_test::basic_cstring<char_const>::null;
  local_468 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0xb1;
  file_16.m_begin = (iterator)&local_460;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_470,
             msg_16);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xb1,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_118.second.m_flags == '\0') {
    local_118.second.m_prev = local_a8.second.m_prev;
    local_118.second.m_next = &local_a8;
    ((local_a8.second.m_prev)->second).m_next = &local_118;
    local_a8.second.m_prev = &local_118;
  }
  local_118.second._16_8_ = local_118.second._16_8_ | 2;
  local_480 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_478 = "";
  local_490 = &boost::unit_test::basic_cstring<char_const>::null;
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0xb5;
  file_17.m_begin = (iterator)&local_480;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_490,
             msg_17);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\x03');
  local_268 = (CoinsCachePair *)CONCAT44(local_268._4_4_,3);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013ae248;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0xb5,&local_1d0,
             "CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0xb6;
  file_18.m_begin = (iterator)&local_4a0;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_4b0,
             msg_18);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a1c,(size_t)&local_1b0,0xb6,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4b8 = "";
  local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0xb7;
  file_19.m_begin = (iterator)&local_4c0;
  msg_19.m_end = pvVar6;
  msg_19.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_4d0,
             msg_19);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a2d,(size_t)&local_1b0,0xb7,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_4e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4d8 = "";
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0xb8;
  file_20.m_begin = (iterator)&local_4e0;
  msg_20.m_end = pvVar6;
  msg_20.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_4f0,
             msg_20);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xb8,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0xb9;
  file_21.m_begin = (iterator)&local_500;
  msg_21.m_end = pvVar6;
  msg_21.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_510,
             msg_21);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xb9,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_118.second.m_flags != '\0') {
    ((local_118.second.m_next)->second).m_prev = local_118.second.m_prev;
    ((local_118.second.m_prev)->second).m_next = local_118.second.m_next;
    local_118.second._16_8_ = local_118.second._16_8_ & 0xffffffffffffff00;
  }
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_518 = "";
  local_530 = &boost::unit_test::basic_cstring<char_const>::null;
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0xbd;
  file_22.m_begin = (iterator)&local_520;
  msg_22.m_end = pvVar6;
  msg_22.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_530,
             msg_22);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\0');
  local_268 = (CoinsCachePair *)((ulong)local_268 & 0xffffffff00000000);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013ae248;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0xbd,&local_1d0,"0",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_540 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_538 = "";
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0xbe;
  file_23.m_begin = (iterator)&local_540;
  msg_23.m_end = pvVar6;
  msg_23.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_550,
             msg_23);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xbe,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_24.m_end = (iterator)0xbf;
  file_24.m_begin = (iterator)&local_560;
  msg_24.m_end = pvVar6;
  msg_24.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_570,
             msg_24);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0xbf,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_578 = "";
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  local_588 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = &DAT_000000c0;
  file_25.m_begin = (iterator)&local_580;
  msg_25.m_end = pvVar6;
  msg_25.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_590,
             msg_25);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a57,(size_t)&local_1b0,0xc0,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_5a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_598 = "";
  local_5b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0xc1;
  file_26.m_begin = (iterator)&local_5a0;
  msg_26.m_end = pvVar6;
  msg_26.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_5b0,
             msg_26);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xc1,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_118.second.m_flags != '\0') {
    ((local_118.second.m_next)->second).m_prev = local_118.second.m_prev;
    ((local_118.second.m_prev)->second).m_next = local_118.second.m_next;
    local_118.second._16_8_ = local_118.second._16_8_ & 0xffffffffffffff00;
  }
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0xc5;
  file_27.m_begin = (iterator)&local_5c0;
  msg_27.m_end = pvVar6;
  msg_27.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_5d0,
             msg_27);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\0');
  local_268 = (CoinsCachePair *)((ulong)local_268 & 0xffffffff00000000);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013ae248;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0xc5,&local_1d0,"0",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5d8 = "";
  local_5f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0xc6;
  file_28.m_begin = (iterator)&local_5e0;
  msg_28.m_end = pvVar6;
  msg_28.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_5f0,
             msg_28);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xc6,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_600 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_5f8 = "";
  local_610 = &boost::unit_test::basic_cstring<char_const>::null;
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0xc7;
  file_29.m_begin = (iterator)&local_600;
  msg_29.m_end = pvVar6;
  msg_29.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_610,
             msg_29);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,199,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0xc8;
  file_30.m_begin = (iterator)&local_620;
  msg_30.m_end = pvVar6;
  msg_30.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_630,
             msg_30);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a57,(size_t)&local_1b0,200,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_638 = "";
  local_650 = &boost::unit_test::basic_cstring<char_const>::null;
  local_648 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0xc9;
  file_31.m_begin = (iterator)&local_640;
  msg_31.m_end = pvVar6;
  msg_31.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_650,
             msg_31);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xc9,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_660 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_658 = "";
  local_670 = &boost::unit_test::basic_cstring<char_const>::null;
  local_668 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0xcd;
  file_32.m_begin = (iterator)&local_660;
  msg_32.m_end = pvVar6;
  msg_32.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_670,
             msg_32);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_next;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe7490a,(size_t)&local_1b0,0xcd,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_680 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_678 = "";
  local_690 = &boost::unit_test::basic_cstring<char_const>::null;
  local_688 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0xce;
  file_33.m_begin = (iterator)&local_680;
  msg_33.m_end = pvVar6;
  msg_33.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_690,
             msg_33);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0xce,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_6a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_698 = "";
  local_6b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_34.m_end = (iterator)0xcf;
  file_34.m_begin = (iterator)&local_6a0;
  msg_34.m_end = pvVar6;
  msg_34.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_34,(size_t)&local_6b0,
             msg_34);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a57,(size_t)&local_1b0,0xcf,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_6c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6b8 = "";
  local_6d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_35.m_end = (iterator)0xd0;
  file_35.m_begin = (iterator)&local_6c0;
  msg_35.m_end = pvVar6;
  msg_35.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_35,(size_t)&local_6d0,
             msg_35);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_prev;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a68,(size_t)&local_1b0,0xd0,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_118.second.m_flags == '\0') {
    local_118.second.m_prev = local_a8.second.m_prev;
    local_118.second.m_next = &local_a8;
    ((local_a8.second.m_prev)->second).m_next = &local_118;
    local_a8.second.m_prev = &local_118;
  }
  local_118.second._16_8_ = local_118.second._16_8_ | 1;
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_36.m_end = (iterator)0xd4;
  file_36.m_begin = (iterator)&local_6e0;
  msg_36.m_end = pvVar6;
  msg_36.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_36,(size_t)&local_6f0,
             msg_36);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_270 = (CoinsCachePair *)CONCAT71(local_270._1_7_,local_118.second.m_flags);
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_flags == '\x01');
  local_268 = (CoinsCachePair *)CONCAT44(local_268._4_4_,1);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = &local_270;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013aee50;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = (CoinsCachePair **)&local_268;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af730;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a07,(size_t)&local_1b0,0xd4,&local_1d0,
             "CCoinsCacheEntry::DIRTY",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_6f8 = "";
  local_710 = &boost::unit_test::basic_cstring<char_const>::null;
  local_708 = &boost::unit_test::basic_cstring<char_const>::null;
  file_37.m_end = (iterator)0xd5;
  file_37.m_begin = (iterator)&local_700;
  msg_37.m_end = pvVar6;
  msg_37.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_37,(size_t)&local_710,
             msg_37);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_188.second.m_next;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_188.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a57,(size_t)&local_1b0,0xd5,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_720 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_718 = "";
  local_730 = &boost::unit_test::basic_cstring<char_const>::null;
  local_728 = &boost::unit_test::basic_cstring<char_const>::null;
  file_38.m_end = (iterator)0xd6;
  file_38.m_begin = (iterator)&local_720;
  msg_38.m_end = pvVar6;
  msg_38.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_38,(size_t)&local_730,
             msg_38);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_prev;
  local_270 = &local_188;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a2d,(size_t)&local_1b0,0xd6,&local_1d0,"&n2",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_39.m_end = (iterator)0xd7;
  file_39.m_begin = (iterator)&local_740;
  msg_39.m_end = pvVar6;
  msg_39.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_39,(size_t)&local_750,
             msg_39);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_118.second.m_next;
  local_270 = &local_a8;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_118.second.m_next == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74a1c,(size_t)&local_1b0,0xd7,&local_1d0,
             "&sentinel",&local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_758 = "";
  local_770 = &boost::unit_test::basic_cstring<char_const>::null;
  local_768 = &boost::unit_test::basic_cstring<char_const>::null;
  file_40.m_end = (iterator)0xd8;
  file_40.m_begin = (iterator)&local_760;
  msg_40.m_end = pvVar6;
  msg_40.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_40,(size_t)&local_770,
             msg_40);
  local_240.m_empty = false;
  local_240._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ae088;
  local_230 = boost::unit_test::lazy_ostream::inst;
  local_228 = "";
  local_268 = local_a8.second.m_prev;
  local_270 = &local_118;
  local_1a0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_a8.second.m_prev == local_270);
  local_1a0.m_message.px = (element_type *)0x0;
  local_1a0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/coinscachepair_tests.cpp"
  ;
  local_1a8 = "";
  local_1d8 = (CoinsCachePair **)&local_268;
  local_1c8 = 0;
  local_1d0 = &PTR__lazy_ostream_013af770;
  local_1c0 = boost::unit_test::lazy_ostream::inst;
  local_1b8 = &local_1d8;
  local_200 = &local_270;
  local_1f0 = 0;
  local_1f8 = &PTR__lazy_ostream_013af770;
  local_1e8 = boost::unit_test::lazy_ostream::inst;
  local_1e0 = &local_200;
  boost::test_tools::tt_detail::report_assertion
            (&local_1a0,&local_240,1,2,REQUIRE,0xe74883,(size_t)&local_1b0,0xd8,&local_1d0,"&n1",
             &local_1f8);
  boost::detail::shared_count::~shared_count(&local_1a0.m_message.pn);
  if (local_188.second.m_flags != '\0') {
    ((local_188.second.m_next)->second).m_prev = local_188.second.m_prev;
    ((local_188.second.m_prev)->second).m_next = local_188.second.m_next;
    local_188.second._16_8_ = local_188.second._16_8_ & 0xffffffffffffff00;
  }
  if (0x1c < local_188.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_188.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect)
    ;
  }
  if (local_118.second.m_flags != '\0') {
    ((local_118.second.m_next)->second).m_prev = local_118.second.m_prev;
    ((local_118.second.m_prev)->second).m_next = local_118.second.m_next;
    local_118.second._16_8_ = local_118.second._16_8_ & 0xffffffffffffff00;
  }
  if (0x1c < local_118.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_118.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect)
    ;
  }
  pCVar4 = local_a8.second.m_next;
  pCVar3 = local_a8.second.m_prev;
  if (local_a8.second.m_flags != '\0') {
    ((local_a8.second.m_next)->second).m_prev = local_a8.second.m_prev;
    (pCVar3->second).m_next = pCVar4;
    local_a8.second._16_8_ = local_a8.second._16_8_ & 0xffffffffffffff00;
  }
  if (0x1c < local_a8.second.coin.out.scriptPubKey.super_CScriptBase._size) {
    free(local_a8.second.coin.out.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(linked_list_add_flags)
{
    CoinsCachePair sentinel;
    sentinel.second.SelfRef(sentinel);
    CoinsCachePair n1;
    CoinsCachePair n2;

    // Check that adding 0 flag has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &sentinel);

    // Check that adding DIRTY flag inserts it into linked list and sets flags
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);

    // Check that adding FRESH flag on new node inserts it after n1
    n2.second.AddFlags(CCoinsCacheEntry::FRESH, n2, sentinel);
    BOOST_CHECK_EQUAL(n2.second.GetFlags(), CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);

    // Check that adding 0 flag has no effect, and doesn't change position
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can add extra flags, but they don't change our position
    n1.second.AddFlags(CCoinsCacheEntry::FRESH, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY | CCoinsCacheEntry::FRESH);
    BOOST_CHECK_EQUAL(n1.second.Next(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &n1);

    // Check that we can clear flags then re-add them
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Check that calling `ClearFlags` with 0 flags has no effect
    n1.second.ClearFlags();
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), 0);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // Adding 0 still has no effect
    n1.second.AddFlags(0, n1, sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Next(), &n2);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n2.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(n2.second.Prev(), &sentinel);

    // But adding DIRTY re-inserts it after n2
    n1.second.AddFlags(CCoinsCacheEntry::DIRTY, n1, sentinel);
    BOOST_CHECK_EQUAL(n1.second.GetFlags(), CCoinsCacheEntry::DIRTY);
    BOOST_CHECK_EQUAL(n2.second.Next(), &n1);
    BOOST_CHECK_EQUAL(n1.second.Prev(), &n2);
    BOOST_CHECK_EQUAL(n1.second.Next(), &sentinel);
    BOOST_CHECK_EQUAL(sentinel.second.Prev(), &n1);
}